

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment-map.c
# Opt level: O1

_Bool mi_is_in_heap_region(void *p)

{
  _Bool _Var1;
  undefined8 in_RAX;
  undefined1 local_11;
  
  _Var1 = _mi_arena_contains(p);
  local_11 = 1;
  if (!_Var1) {
    if (p == (void *)0x0) {
      local_11 = 0;
    }
    else {
      mi_is_in_heap_region_cold_1();
      local_11 = (byte)((ulong)in_RAX >> 0x38);
    }
  }
  return (_Bool)(local_11 & 1);
}

Assistant:

bool mi_is_in_heap_region(const void* p) mi_attr_noexcept {
  return mi_is_valid_pointer(p);
}